

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall
google::protobuf::UnknownFieldSet::MergeFromAndDestroy(UnknownFieldSet *this,UnknownFieldSet *other)

{
  bool bVar1;
  Arena *pAVar2;
  Arena *pAVar3;
  
  pAVar2 = RepeatedField<google::protobuf::UnknownField>::GetArena(&this->fields_);
  pAVar3 = RepeatedField<google::protobuf::UnknownField>::GetArena(&other->fields_);
  if (pAVar2 != pAVar3) {
    MergeFrom(this,other);
    return;
  }
  bVar1 = RepeatedField<google::protobuf::UnknownField>::empty(&this->fields_);
  if (bVar1) {
    RepeatedField<google::protobuf::UnknownField>::Swap(&this->fields_,&other->fields_);
    return;
  }
  RepeatedField<google::protobuf::UnknownField>::MergeFrom(&this->fields_,&other->fields_);
  RepeatedField<google::protobuf::UnknownField>::Clear(&other->fields_);
  return;
}

Assistant:

void UnknownFieldSet::MergeFromAndDestroy(UnknownFieldSet* other) {
  if (arena() != other->arena()) {
    MergeFrom(*other);
  } else if (fields_.empty()) {
    fields_.Swap(&other->fields_);
  } else {
    fields_.MergeFrom(other->fields_);
    other->fields_.Clear();
  }
}